

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O2

int __thiscall OpaqueType::serialise(OpaqueType *this,uint8_t *buf,size_t max_len)

{
  uint uVar1;
  
  uVar1 = BER_CONTAINER::serialise(&this->super_BER_CONTAINER,buf,max_len,(long)this->_dataLength);
  if (-1 < (int)uVar1) {
    memcpy(buf + uVar1,this->_value,(long)this->_dataLength);
    uVar1 = ((int)(buf + uVar1) + this->_dataLength) - (int)buf;
  }
  return uVar1;
}

Assistant:

int OpaqueType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, _dataLength);
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;

    memcpy(ptr, _value, _dataLength);
    ptr += _dataLength;

    return ptr - buf;
}